

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::~Report(Report *this)

{
  ~Report(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~Report() { Clear(); }